

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void __thiscall CGraph::Scale(CGraph *this)

{
  float fVar1;
  bool bVar2;
  long lVar3;
  CGraph *pCVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  uVar5._0_4_ = this->m_MinRange;
  uVar5._4_4_ = this->m_MaxRange;
  this->m_Min = (float)(undefined4)uVar5;
  this->m_Max = (float)uVar5._4_4_;
  fVar7 = (float)uVar5._4_4_;
  for (lVar3 = 4; lVar3 != 0x84; lVar3 = lVar3 + 1) {
    fVar1 = this->m_aValues[lVar3 + -4];
    fVar8 = (float)uVar5;
    pCVar4 = (CGraph *)&this->m_Max;
    fVar6 = fVar1;
    if ((fVar7 < fVar1) ||
       (bVar2 = fVar1 < fVar8, pCVar4 = this, fVar6 = fVar7, fVar8 = fVar1, bVar2)) {
      pCVar4->m_Min = fVar1;
      uVar5 = (ulong)(uint)fVar8;
      fVar7 = fVar6;
    }
  }
  return;
}

Assistant:

void CGraph::Scale()
{
	m_Min = m_MinRange;
	m_Max = m_MaxRange;
	for(int i = 0; i < MAX_VALUES; i++)
	{
		if(m_aValues[i] > m_Max)
			m_Max = m_aValues[i];
		else if(m_aValues[i] < m_Min)
			m_Min = m_aValues[i];
	}
}